

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsact.c
# Opt level: O0

void hocfunchack(Symbol *n,Item *qpar1,Item *qpar2,int hack)

{
  Item *str;
  int in_ECX;
  Symbol *in_RDI;
  Item *qp;
  int i;
  Item *q;
  Symbol *sym;
  uint in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int iVar1;
  
  sym = (Symbol *)0x0;
  lappendstr((List *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),(char *)0x0);
  if (point_process == 0) {
    sprintf(buf,"\nstatic void _hoc_%s(void) {\n  double _r;\n",in_RDI->name);
  }
  else {
    sprintf(buf,"\nstatic double _hoc_%s(void* _vptr) {\n double _r;\n",in_RDI->name);
  }
  lappendstr((List *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),(char *)sym);
  lappendstr((List *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),(char *)sym);
  vectorize_substitute
            ((Item *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),(char *)sym);
  if (point_process == 0) {
    lappendstr((List *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),(char *)sym);
    vectorize_substitute
              ((Item *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),(char *)sym);
  }
  else {
    lappendstr((List *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),(char *)sym);
    vectorize_substitute
              ((Item *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),(char *)sym);
  }
  if (in_RDI == last_func_using_table) {
    sym = (Symbol *)
          lappendstr((List *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                     (char *)sym);
    sprintf(buf,"\n#if 1\n _check_%s(_threadargs_);\n#endif\n",in_RDI->name);
    vectorize_substitute
              ((Item *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),(char *)sym);
  }
  if ((in_RDI->subtype & 0x40U) == 0) {
    lappendstr((List *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),(char *)sym);
  }
  else {
    lappendstr((List *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),(char *)sym);
  }
  lappendsym((List *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),sym);
  lappendstr((List *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),(char *)sym);
  str = lappendstr((List *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),(char *)sym
                  );
  for (iVar1 = 0; iVar1 < in_RDI->varnum; iVar1 = iVar1 + 1) {
    sprintf(buf,"*getarg(%d)",(ulong)(iVar1 + 1));
    lappendstr((List *)CONCAT44(iVar1,in_stack_ffffffffffffffd0),(char *)str);
    if (iVar1 + 1 < in_RDI->varnum) {
      lappendstr((List *)CONCAT44(iVar1,in_stack_ffffffffffffffd0),(char *)str);
    }
  }
  if (point_process == 0) {
    lappendstr((List *)CONCAT44(iVar1,in_stack_ffffffffffffffd0),(char *)str);
  }
  else {
    lappendstr((List *)CONCAT44(iVar1,in_stack_ffffffffffffffd0),(char *)str);
  }
  lappendstr((List *)CONCAT44(iVar1,in_stack_ffffffffffffffd0),(char *)str);
  if (iVar1 == 0) {
    if (in_ECX == 0) {
      vectorize_substitute((Item *)(ulong)in_stack_ffffffffffffffd0,(char *)str);
    }
  }
  else {
    vectorize_substitute((Item *)CONCAT44(iVar1,in_stack_ffffffffffffffd0),(char *)str);
  }
  return;
}

Assistant:

void hocfunchack(Symbol* n, Item* qpar1, Item* qpar2, int hack)
{
#if NOCMODL
	extern int point_process;
#endif
	Item *q;
	int i;
#if VECTORIZE
	Item* qp=0;
#endif
	
#if BBCORE 
 Lappendstr(procfunc, "\n#if 0 /*BBCORE*/\n");
#endif
   if (point_process) {
	Sprintf(buf, "\nstatic double _hoc_%s(void* _vptr) {\n double _r;\n", n->name);
   }else{
	Sprintf(buf, "\nstatic void _hoc_%s(void) {\n  double _r;\n", n->name);
   }
	Lappendstr(procfunc, buf);
	vectorize_substitute(lappendstr(procfunc, ""), "\
  double* _p; Datum* _ppvar; ThreadDatum* _thread; NrnThread* _nt;\n\
");
	if (point_process) {
		vectorize_substitute(lappendstr(procfunc, "  _hoc_setdata(_vptr);\n"), "\
  _p = ((Point_process*)_vptr)->_prop->param;\n\
  _ppvar = ((Point_process*)_vptr)->_prop->dparam;\n\
  _thread = _extcall_thread;\n\
  _nt = (NrnThread*)((Point_process*)_vptr)->_vnt;\n\
");
	}else{
		vectorize_substitute(lappendstr(procfunc, ""), "\
  if (_extcall_prop) {_p = _extcall_prop->param; _ppvar = _extcall_prop->dparam;}else{ _p = (double*)0; _ppvar = (Datum*)0; }\n\
  _thread = _extcall_thread;\n\
  _nt = nrn_threads;\n\
");
	}
#if VECTORIZE
	if (n == last_func_using_table) {
		qp = lappendstr(procfunc, "");
		sprintf(buf,"\n#if 1\n _check_%s(_threadargs_);\n#endif\n", n->name);
		vectorize_substitute(qp, buf);
	}
#endif
	if (n->subtype & FUNCT) {
		Lappendstr(procfunc, "_r = ");
	}else{
		Lappendstr(procfunc, "_r = 1.;\n");
	}
	Lappendsym(procfunc, n);
	lappendstr(procfunc, "(");
#if VECTORIZE
	qp = lappendstr(procfunc, "");
#endif
	for (i=0; i < n->varnum; ++i) {
		Sprintf(buf, "*getarg(%d)", i+1);
		Lappendstr(procfunc, buf);
		if (i+1 < n->varnum) {
			Lappendstr(procfunc, ",");
		}
	}
#if NOCMODL
   if (point_process) {
	Lappendstr(procfunc, ");\n return(_r);\n}\n");
   }else
#endif
	Lappendstr(procfunc, ";\n hoc_retpushx(_r);\n}\n");
#if BBCORE 
	Lappendstr(procfunc, "\n#endif /*BBCORE*/\n");
#endif
#if VECTORIZE
	if (i) {
		vectorize_substitute(qp, "_threadargs_,");
	}else if (!hack) {
		vectorize_substitute(qp, "_threadargs_");
	}
#endif
}